

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O2

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *Value)

{
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *pMVar1;
  KUINT16 i;
  long lVar2;
  long lVar3;
  
  pMVar1 = this;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(float (*) [3])*(float (*) [3])this)[lVar3] =
           (*(float (*) [3])*(float (*) [3])Value)[lVar3] +
           (*(float (*) [3])*(float (*) [3])this)[lVar3];
    }
    Value = (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)((long)Value + 0xc);
    this = (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)((long)this + 0xc);
  }
  return pMVar1;
}

Assistant:

Matrix & operator += ( const Matrix & Value )
    {
        for( KUINT16 i = 0; i < cols; ++i )
        {
            for( KUINT16 j = 0; j < rows; ++j )
            {
                Data[i][j] += Value.Data[i][j];
            }
        }

        return *this;
    }